

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# strutil.cc
# Opt level: O2

bool google::protobuf::safe_parse_negative_int<long>(string *text,long *value_p)

{
  byte *pbVar1;
  byte *pbVar2;
  long lVar3;
  ulong uVar4;
  
  pbVar1 = (byte *)(text->_M_dataplus)._M_p;
  pbVar2 = pbVar1 + text->_M_string_length;
  lVar3 = 0;
  while( true ) {
    if ((pbVar2 <= pbVar1) || ((byte)(*pbVar1 - 0x3a) < 0xf6)) goto LAB_002199a7;
    if (lVar3 < -0xccccccccccccccc) break;
    uVar4 = (ulong)(*pbVar1 & 0xf);
    if (lVar3 * 10 < (long)(uVar4 | 0x8000000000000000)) break;
    lVar3 = lVar3 * 10 - uVar4;
    pbVar1 = pbVar1 + 1;
  }
  lVar3 = -0x8000000000000000;
LAB_002199a7:
  *value_p = lVar3;
  return pbVar2 <= pbVar1;
}

Assistant:

bool safe_parse_negative_int(const std::string &text, IntType *value_p) {
  int base = 10;
  IntType value = 0;
  const IntType vmin = std::numeric_limits<IntType>::min();
  assert(vmin < 0);
  assert(vmin <= 0 - base);
  IntType vmin_over_base = vmin / base;
  // 2003 c++ standard [expr.mul]
  // "... the sign of the remainder is implementation-defined."
  // Although (vmin/base)*base + vmin%base is always vmin.
  // 2011 c++ standard tightens the spec but we cannot rely on it.
  if (vmin % base > 0) {
    vmin_over_base += 1;
  }
  const char* start = text.data();
  const char* end = start + text.size();
  // loop over digits
  for (; start < end; ++start) {
    unsigned char c = static_cast<unsigned char>(start[0]);
    int digit = c - '0';
    if (digit >= base || digit < 0) {
      *value_p = value;
      return false;
    }
    if (value < vmin_over_base) {
      *value_p = vmin;
      return false;
    }
    value *= base;
    if (value < vmin + digit) {
      *value_p = vmin;
      return false;
    }
    value -= digit;
  }
  *value_p = value;
  return true;
}